

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindExtensionByPrintableName
          (DescriptorPool *this,Descriptor *extendee,string_view printable_name)

{
  byte bVar1;
  long lVar2;
  FieldDescriptor *pFVar3;
  Symbol SVar4;
  Descriptor *pDVar5;
  Nonnull<const_char_*> pcVar6;
  bool bVar7;
  ulong uVar8;
  ulong v1;
  long lVar9;
  FieldDescriptor *unaff_R14;
  bool bVar10;
  
  if (extendee->extension_range_count_ != 0) {
    pFVar3 = FindExtensionByName(this,printable_name);
    if ((pFVar3 != (FieldDescriptor *)0x0) &&
       (unaff_R14 = pFVar3, pFVar3->containing_type_ == extendee)) {
      return pFVar3;
    }
    if ((extendee->options_->field_0)._impl_.message_set_wire_format_ == true) {
      SVar4 = Tables::FindByNameHelper
                        ((this->tables_)._M_t.
                         super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                         .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                         _M_head_impl,this,printable_name);
      if ((SVar4.ptr_)->symbol_type_ == '\x01') {
        uVar8 = (ulong)*(int *)(SVar4.ptr_ + 0x94);
        bVar10 = (long)uVar8 < 1;
        if (0 < (long)uVar8) {
          lVar9 = 0x48;
          v1 = 0;
          pFVar3 = unaff_R14;
          do {
            if ((long)v1 < (long)*(int *)(SVar4.ptr_ + 0x94)) {
              pcVar6 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                 (v1,(long)*(int *)(SVar4.ptr_ + 0x94),"index < extension_count()");
            }
            if (pcVar6 != (Nonnull<const_char_*>)0x0) {
              FindExtensionByPrintableName();
LAB_00f104e2:
              FindExtensionByPrintableName();
            }
            lVar2 = *(long *)(SVar4.ptr_ + 0x68);
            if (((*(Descriptor **)(lVar2 + -0x28 + lVar9) != extendee) ||
                (*(char *)(lVar2 + -0x46 + lVar9) != '\v')) ||
               (*(int *)(*(long *)(lVar2 + lVar9) + 0x30) == 3)) goto LAB_00f1043b;
            bVar1 = *(byte *)(lVar2 + -0x47 + lVar9);
            bVar7 = (bool)((bVar1 & 0x20) >> 5);
            if (0xbf < bVar1 == bVar7) {
              pcVar6 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                 (bVar7,0xbf < bVar1,
                                  "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            }
            if (pcVar6 != (Nonnull<const_char_*>)0x0) goto LAB_00f104e2;
            if ((*(byte *)(lVar2 + -0x47 + lVar9) & 0x20) == 0) {
              unaff_R14 = (FieldDescriptor *)(lVar2 + lVar9 + -0x48);
              pDVar5 = FieldDescriptor::message_type(unaff_R14);
              if (pDVar5 != (Descriptor *)SVar4.ptr_) goto LAB_00f1043b;
              bVar7 = false;
            }
            else {
LAB_00f1043b:
              bVar7 = true;
              unaff_R14 = pFVar3;
            }
            if (!bVar7) break;
            v1 = v1 + 1;
            bVar10 = uVar8 <= v1;
            lVar9 = lVar9 + 0x58;
            pFVar3 = unaff_R14;
          } while (uVar8 != v1);
        }
      }
      else {
        bVar10 = true;
      }
      if (!bVar10) {
        return unaff_R14;
      }
    }
  }
  return (FieldDescriptor *)0x0;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindExtensionByPrintableName(
    const Descriptor* extendee, absl::string_view printable_name) const {
  if (extendee->extension_range_count() == 0) return nullptr;
  const FieldDescriptor* result = FindExtensionByName(printable_name);
  if (result != nullptr && result->containing_type() == extendee) {
    return result;
  }
  if (extendee->options().message_set_wire_format()) {
    // MessageSet extensions may be identified by type name.
    const Descriptor* type = FindMessageTypeByName(printable_name);
    if (type != nullptr) {
      // Look for a matching extension in the foreign type's scope.
      const int type_extension_count = type->extension_count();
      for (int i = 0; i < type_extension_count; i++) {
        const FieldDescriptor* extension = type->extension(i);
        if (extension->containing_type() == extendee &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            !extension->is_required() && !extension->is_repeated() &&
            extension->message_type() == type) {
          // Found it.
          return extension;
        }
      }
    }
  }
  return nullptr;
}